

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

lines_t * __thiscall
backward::SourceFile::get_lines(SourceFile *this,uint line_start,uint line_count,lines_t *lines)

{
  basic_ifstream<char,_std::char_traits<char>_> *pbVar1;
  const_iterator __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  string line;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  pointer local_68;
  pointer local_60;
  undefined1 local_58 [40];
  
  pbVar1 = (this->_file)._val;
  uVar4 = 0;
  std::ios::clear((int)pbVar1 + (int)*(undefined8 *)(*(long *)pbVar1 + -0x18));
  std::istream::seekg((this->_file)._val,0,0);
  local_88 = local_78;
  local_80 = 0;
  local_78[0] = 0;
  uVar5 = line_start + (line_start == 0);
  do {
    uVar4 = uVar4 + 1;
    if (line_start <= uVar4) {
      bVar3 = false;
      goto LAB_0015600a;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)(this->_file)._val,(string *)&local_88);
    pbVar1 = (this->_file)._val;
  } while (((byte)pbVar1[*(long *)(*(long *)pbVar1 + -0x18) + 0x20] & 5) == 0);
LAB_001560be:
  std::__cxx11::string::~string((string *)&local_88);
  return lines;
LAB_0015600a:
  if (line_count + line_start <= uVar5) goto LAB_00156087;
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)(this->_file)._val,(string *)&local_88);
  pbVar1 = (this->_file)._val;
  if (((byte)pbVar1[*(long *)(*(long *)pbVar1 + -0x18) + 0x20] & 5) != 0) goto LAB_001560be;
  if ((bVar3) ||
     (_Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<backward::SourceFile::not_isspace>>
                        (local_88,local_88 + local_80), _Var2._M_current != local_88 + local_80)) {
    local_58._0_4_ = uVar5;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_88);
    std::
    vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>
    ::emplace_back<std::pair<unsigned_int,std::__cxx11::string>>
              ((vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>
                *)lines,(pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  uVar5 = uVar5 + 1;
  goto LAB_0015600a;
LAB_00156087:
  local_60 = (lines->
             super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_68 = (lines->
             super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,std::__cxx11::string>*,std::vector<std::pair<unsigned_int,std::__cxx11::string>,std::allocator<std::pair<unsigned_int,std::__cxx11::string>>>>>,backward::SourceFile::not_isempty>
            (local_58);
  __first._M_current._4_4_ = local_58._4_4_;
  __first._M_current._0_4_ = local_58._0_4_;
  std::
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase(lines,__first,
          (lines->
          super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish);
  goto LAB_001560be;
}

Assistant:

lines_t &get_lines(unsigned line_start, unsigned line_count, lines_t &lines) {
    using namespace std;
    // This function make uses of the dumbest algo ever:
    //	1) seek(0)
    //	2) read lines one by one and discard until line_start
    //	3) read line one by one until line_start + line_count
    //
    // If you are getting snippets many time from the same file, it is
    // somewhat a waste of CPU, feel free to benchmark and propose a
    // better solution ;)

    _file->clear();
    _file->seekg(0);
    string line;
    unsigned line_idx;

    for (line_idx = 1; line_idx < line_start; ++line_idx) {
      std::getline(*_file, line);
      if (!*_file) {
        return lines;
      }
    }

    // think of it like a lambda in C++98 ;)
    // but look, I will reuse it two times!
    // What a good boy am I.
    struct isspace {
      bool operator()(char c) { return std::isspace(c); }
    };

    bool started = false;
    for (; line_idx < line_start + line_count; ++line_idx) {
      getline(*_file, line);
      if (!*_file) {
        return lines;
      }
      if (!started) {
        if (std::find_if(line.begin(), line.end(), not_isspace()) == line.end())
          continue;
        started = true;
      }
      lines.push_back(make_pair(line_idx, line));
    }

    lines.erase(
        std::find_if(lines.rbegin(), lines.rend(), not_isempty()).base(),
        lines.end());
    return lines;
  }